

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double nifti_stat2hzscore(double val,int code,double p1,double p2,double p3)

{
  double dVar1;
  pqpair pVar2;
  undefined8 local_50;
  pqpair pq;
  double p3_local;
  double p2_local;
  double p1_local;
  int code_local;
  double val_local;
  
  pVar2 = stat2pq(val,code,p1,p2,p3);
  local_50 = pVar2.p;
  pVar2.q = (1.0 - local_50) * 0.5;
  pVar2.p = (local_50 + 1.0) * 0.5;
  dVar1 = normal_pq2s(pVar2);
  return dVar1;
}

Assistant:

double nifti_stat2hzscore( double val, int code, double p1,double p2,double p3 )
{
   pqpair pq ;

   pq = stat2pq( val, code, p1,p2,p3 ) ;                    /* find cdf */
   pq.q = 0.5*(1.0-pq.p) ; pq.p = 0.5*(1.0+pq.p) ;          /* mangle it */
   return normal_pq2s( pq ) ;                               /* find z  */
}